

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::FormatCountableNoun_abi_cxx11_(int count,char *singular_form,char *plural_form)

{
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  string *in_RDI;
  char *in_stack_ffffffffffffff70;
  string *__lhs;
  int *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  char *local_18;
  int local_c;
  
  __lhs = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  internal::StreamableToString<int>(in_stack_ffffffffffffff98);
  std::operator+(__lhs,in_stack_ffffffffffffff70);
  if (local_c == 1) {
    local_20 = local_18;
  }
  std::operator+(__lhs,local_20);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return in_RDI;
}

Assistant:

static std::string FormatCountableNoun(int count, const char* singular_form,
                                       const char* plural_form) {
  return internal::StreamableToString(count) + " " +
         (count == 1 ? singular_form : plural_form);
}